

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_simd_scalar_three_reg_same_extra(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  TCGTemp *pTVar1;
  TCGv_i32 tcg_dest;
  TCGv_i32 tcg_dest_00;
  MemOp memop;
  code *func;
  uintptr_t o;
  TCGv_i32 tcg_dest_01;
  uint uVar2;
  uintptr_t o_2;
  TCGTemp *local_58;
  TCGv_i32 local_50;
  TCGv_i32 local_48;
  TCGTemp *local_40;
  
  if ((((insn >> 0xb & 0xe | insn >> 0x19 & 0x10) != 0x10) ||
      (memop = insn >> 0x16 & MO_64, memop - MO_64 < 0xfffffffe)) ||
     ((s->isar->id_aa64isar0 & 0xf0000000) == 0)) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s_00 = s->uc->tcg_ctx;
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  tcg_dest_01 = (TCGv_i32)((long)pTVar1 - (long)s_00);
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  tcg_dest = (TCGv_i32)((long)pTVar1 - (long)s_00);
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  tcg_dest_00 = (TCGv_i32)((long)pTVar1 - (long)s_00);
  read_vec_element_i32
            ((DisasContext_conflict1 *)s->uc->tcg_ctx,tcg_dest_01,insn >> 5 & 0x1f,0,memop);
  read_vec_element_i32
            ((DisasContext_conflict1 *)s->uc->tcg_ctx,tcg_dest,insn >> 0x10 & 0x1f,0,memop);
  read_vec_element_i32((DisasContext_conflict1 *)s->uc->tcg_ctx,tcg_dest_00,insn & 0x1f,0,memop);
  uVar2 = insn >> 0xb & 0xf;
  if ((short)uVar2 == 1) {
    local_58 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
    if (memop == MO_16) {
      func = helper_neon_qrdmlsh_s16_aarch64;
    }
    else {
      func = helper_neon_qrdmlsh_s32_aarch64;
    }
  }
  else {
    if (uVar2 != 0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x25bf,(char *)0x0);
    }
    local_58 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
    if (memop == MO_16) {
      func = helper_neon_qrdmlah_s16_aarch64;
    }
    else {
      func = helper_neon_qrdmlah_s32_aarch64;
    }
  }
  local_48 = tcg_dest + (long)s_00;
  local_50 = (TCGv_i32)((long)s_00 + (long)tcg_dest_01);
  local_40 = (TCGTemp *)((long)s_00 + (long)tcg_dest_00);
  tcg_gen_callN_aarch64(s_00,func,local_40,4,&local_58);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_dest_01 + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_dest + (long)s_00));
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  tcg_gen_extu_i32_i64_aarch64(s_00,(TCGv_i64)((long)pTVar1 - (long)s_00),tcg_dest_00);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_dest_00 + (long)s_00));
  write_fp_dreg_aarch64(s,insn & 0x1f,(TCGv_i64)((long)pTVar1 - (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,pTVar1);
  return;
}

Assistant:

static void disas_simd_scalar_three_reg_same_extra(DisasContext *s,
                                                   uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 4);
    int rm = extract32(insn, 16, 5);
    int size = extract32(insn, 22, 2);
    bool u = extract32(insn, 29, 1);
    TCGv_i32 ele1, ele2, ele3;
    TCGv_i64 res;
    bool feature;

    switch (u * 16 + opcode) {
    case 0x10: /* SQRDMLAH (vector) */
    case 0x11: /* SQRDMLSH (vector) */
        if (size != 1 && size != 2) {
            unallocated_encoding(s);
            return;
        }
        feature = dc_isar_feature(aa64_rdm, s);
        break;
    default:
        unallocated_encoding(s);
        return;
    }
    if (!feature) {
        unallocated_encoding(s);
        return;
    }
    if (!fp_access_check(s)) {
        return;
    }

    /* Do a single operation on the lowest element in the vector.
     * We use the standard Neon helpers and rely on 0 OP 0 == 0
     * with no side effects for all these operations.
     * OPTME: special-purpose helpers would avoid doing some
     * unnecessary work in the helper for the 16 bit cases.
     */
    ele1 = tcg_temp_new_i32(tcg_ctx);
    ele2 = tcg_temp_new_i32(tcg_ctx);
    ele3 = tcg_temp_new_i32(tcg_ctx);

    read_vec_element_i32(s, ele1, rn, 0, size);
    read_vec_element_i32(s, ele2, rm, 0, size);
    read_vec_element_i32(s, ele3, rd, 0, size);

    switch (opcode) {
    case 0x0: /* SQRDMLAH */
        if (size == 1) {
            gen_helper_neon_qrdmlah_s16(tcg_ctx, ele3, tcg_ctx->cpu_env, ele1, ele2, ele3);
        } else {
            gen_helper_neon_qrdmlah_s32(tcg_ctx, ele3, tcg_ctx->cpu_env, ele1, ele2, ele3);
        }
        break;
    case 0x1: /* SQRDMLSH */
        if (size == 1) {
            gen_helper_neon_qrdmlsh_s16(tcg_ctx, ele3, tcg_ctx->cpu_env, ele1, ele2, ele3);
        } else {
            gen_helper_neon_qrdmlsh_s32(tcg_ctx, ele3, tcg_ctx->cpu_env, ele1, ele2, ele3);
        }
        break;
    default:
        g_assert_not_reached();
    }
    tcg_temp_free_i32(tcg_ctx, ele1);
    tcg_temp_free_i32(tcg_ctx, ele2);

    res = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_extu_i32_i64(tcg_ctx, res, ele3);
    tcg_temp_free_i32(tcg_ctx, ele3);

    write_fp_dreg(s, rd, res);
    tcg_temp_free_i64(tcg_ctx, res);
}